

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_state_check.h
# Opt level: O0

void __thiscall libaom_test::RegisterStateCheckMMX::Check(RegisterStateCheckMMX *this)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper *this_00;
  undefined2 in_FPULastInstructionOpcode;
  undefined8 in_FPUDataPointer;
  undefined8 in_FPUInstructionPointer;
  AssertionResult gtest_ar_1;
  uint16_t post_fpu_env [14];
  AssertionResult gtest_ar;
  char (*in_stack_ffffffffffffff28) [49];
  AssertHelper *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int line;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  Type type;
  AssertionResult *this_02;
  AssertionResult local_78;
  undefined4 uStack_5c;
  undefined2 in_stack_ffffffffffffffa8;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffffaa;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  this_02 = &local_18;
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (unsigned_short *)in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pMVar2 = testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffff30,
                        (char (*) [47])in_stack_ffffffffffffff28);
    type = (Type)((ulong)pMVar2 >> 0x20);
    in_stack_ffffffffffffff50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12787d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (Message *)
               CONCAT44(in_stack_ffffffffffffffac,
                        CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)));
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0x1278d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12792c);
  uVar4 = (undefined4)in_FPUDataPointer;
  uVar5 = (undefined4)((ulong)in_FPUDataPointer >> 0x20);
  uStack_5c = (undefined4)in_FPUInstructionPointer;
  uVar3 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
  this_01 = &local_78;
  testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             &this_01->success_,in_stack_ffffffffffffff38,
             (unsigned_short *)in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::Message::operator<<((Message *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1279d8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_ffffffffffffff50,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),
               (Message *)CONCAT44(uVar4,CONCAT22(in_FPULastInstructionOpcode,uVar3)));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x127a26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127a72);
  return;
}

Assistant:

void Check() const {
    EXPECT_EQ(0xffff, pre_fpu_env_[4])
        << "FPU was in an inconsistent state prior to call";

    uint16_t post_fpu_env[14];
    __asm__ volatile("fstenv %0" : "=rm"(post_fpu_env));
    EXPECT_EQ(0xffff, post_fpu_env[4])
        << "FPU was left in an inconsistent state after call";
  }